

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O3

void deqp::gles2::Functional::anon_unknown_0::verifyUniformValue4i
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,GLint x,
               GLint y,GLint z,GLint w)

{
  ostringstream *this;
  bool bVar1;
  int iVar2;
  undefined1 auVar3 [16];
  StateQueryMemoryWriteGuard<int[4]> local_1d8;
  undefined1 local_1a8 [384];
  
  local_1d8.m_postguard[0] = -0x21212122;
  local_1d8.m_postguard[1] = -0x21212122;
  local_1d8.m_postguard[2] = -0x21212122;
  local_1d8.m_postguard[3] = -0x21212122;
  local_1d8.m_value[0] = -0x21212122;
  local_1d8.m_value[1] = -0x21212122;
  local_1d8.m_value[2] = -0x21212122;
  local_1d8.m_value[3] = -0x21212122;
  local_1d8.m_preguard[0] = -0x21212122;
  local_1d8.m_preguard[1] = -0x21212122;
  local_1d8.m_preguard[2] = -0x21212122;
  local_1d8.m_preguard[3] = -0x21212122;
  glu::CallLogWrapper::glGetUniformiv(gl,program,location,local_1d8.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                    (&local_1d8,testCtx);
  if (bVar1) {
    auVar3._0_4_ = -(uint)(local_1d8.m_value[0] == 1);
    auVar3._4_4_ = -(uint)(x == local_1d8.m_value[1]);
    auVar3._8_4_ = -(uint)(y == local_1d8.m_value[2]);
    auVar3._12_4_ = -(uint)(z == local_1d8.m_value[3]);
    iVar2 = movmskps(1,auVar3);
    if (iVar2 != 0xf) {
      local_1a8._0_8_ = testCtx->m_log;
      this = (ostringstream *)(local_1a8 + 8);
      std::__cxx11::ostringstream::ostringstream(this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"// ERROR: expected [",0x14);
      std::ostream::operator<<(this,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
      std::ostream::operator<<(this,x);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
      std::ostream::operator<<(this,y);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
      std::ostream::operator<<(this,z);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"]; got [",8);
      std::ostream::operator<<(this,local_1d8.m_value[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
      std::ostream::operator<<(this,local_1d8.m_value[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
      std::ostream::operator<<(this,local_1d8.m_value[2]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
      std::ostream::operator<<(this,local_1d8.m_value[3]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"]",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
      }
    }
  }
  return;
}

Assistant:

void verifyUniformValue4i (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, GLint x, GLint y, GLint z, GLint w)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[4]> state;
	gl.glGetUniformiv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state[0] != x ||
		state[1] != y ||
		state[2] != z ||
		state[3] != w)
	{
		testCtx.getLog() << TestLog::Message
		<< "// ERROR: expected ["
		<< x << ", "
		<< y << ", "
		<< z << ", "
		<< w
		<< "]; got ["
		<< state[0] << ", "
		<< state[1] << ", "
		<< state[2] << ", "
		<< state[3]
		<< "]"
		<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
	}
}